

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void duckdb_je_arena_handle_deferred_work(tsdn_t *tsdn,arena_t *arena)

{
  _Bool _Var1;
  arena_t *in_RDI;
  tsd_t *tsd;
  uint8_t state;
  arena_t *in_stack_ffffffffffffffb8;
  arena_t *tsdn_00;
  arena_stats_large_t *local_38;
  arena_t *in_stack_ffffffffffffffe8;
  undefined1 is_background_thread;
  arena_t *in_stack_fffffffffffffff0;
  arena_t *in_stack_fffffffffffffff8;
  
  if (in_RDI == (arena_t *)0x0) {
    local_38 = (arena_stats_large_t *)0x0;
  }
  else {
    local_38 = (in_RDI->stats).lstats + 0x22;
    in_stack_ffffffffffffffb8 = in_RDI;
    in_stack_ffffffffffffffe8 = in_RDI;
    in_stack_fffffffffffffff0 = in_RDI;
    in_stack_fffffffffffffff8 = in_RDI;
  }
  is_background_thread = (undefined1)((ulong)in_stack_ffffffffffffffe8 >> 0x38);
  tsdn_00 = in_RDI;
  witness_assert_depth_to_rank((witness_tsdn_t *)local_38,WITNESS_RANK_CORE,0);
  _Var1 = decay_immediately((decay_t *)in_RDI);
  if (_Var1) {
    arena_decay_dirty((tsdn_t *)tsdn_00,in_stack_ffffffffffffffb8,SUB81((ulong)in_RDI >> 0x38,0),
                      SUB81((ulong)in_RDI >> 0x30,0));
  }
  arena_background_thread_inactivity_check
            ((tsdn_t *)in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
             (_Bool)is_background_thread);
  return;
}

Assistant:

void arena_handle_deferred_work(tsdn_t *tsdn, arena_t *arena) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	if (decay_immediately(&arena->pa_shard.pac.decay_dirty)) {
		arena_decay_dirty(tsdn, arena, false, true);
	}
	arena_background_thread_inactivity_check(tsdn, arena, false);
}